

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_disarm_test(player *p,loc_conflict grid)

{
  _Bool _Var1;
  player *p_local;
  loc_conflict grid_local;
  
  _Var1 = square_isknown((chunk *)cave,grid);
  if (_Var1) {
    _Var1 = square_iscloseddoor((chunk *)cave,grid);
    if ((!_Var1) || (_Var1 = square_islockeddoor((chunk *)cave,grid), _Var1)) {
      _Var1 = square_isdisarmabletrap((chunk *)cave,grid);
      if (_Var1) {
        grid_local.x._3_1_ = true;
      }
      else {
        msg("You see nothing there to disarm.");
        _Var1 = square_isdisarmabletrap((chunk *)p->cave,grid);
        if (_Var1) {
          square_memorize_traps((chunk_conflict2 *)cave,grid);
          square_light_spot((chunk *)cave,(loc)grid);
        }
        grid_local.x._3_1_ = false;
      }
    }
    else {
      grid_local.x._3_1_ = true;
    }
  }
  else {
    msg("You see nothing there.");
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_disarm_test(struct player *p, struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return false;
	}

	/* Look for a closed, unlocked door to lock */
	if (square_iscloseddoor(cave, grid) && !square_islockeddoor(cave, grid))
		return true;

	/* Look for a trap */
	if (!square_isdisarmabletrap(cave, grid)) {
		msg("You see nothing there to disarm.");
		if (square_isdisarmabletrap(p->cave, grid)) {
			square_memorize_traps(cave, grid);
			square_light_spot(cave, grid);
		}
		return false;
	}

	/* Okay */
	return true;
}